

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicLattice.cpp
# Opt level: O0

void __thiscall CubicLattice::createFaces(CubicLattice *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<int> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<int> __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<int> __l_04;
  long in_RDI;
  double dVar1;
  double dVar2;
  cartesian4 coordinate;
  int vertexIndex;
  int faceIndex;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb20;
  int in_stack_fffffffffffffb2c;
  Lattice *in_stack_fffffffffffffb30;
  Lattice *in_stack_fffffffffffffb38;
  Lattice *in_stack_fffffffffffffb40;
  iterator in_stack_fffffffffffffb48;
  undefined1 *in_stack_fffffffffffffb50;
  _Rb_tree_node_base *local_428;
  string *local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_319;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 *local_308;
  undefined8 local_300;
  vint *in_stack_fffffffffffffd08;
  vstr *in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  uint in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined1 local_2d0 [64];
  string local_290 [32];
  string local_270 [32];
  undefined1 local_250 [48];
  undefined1 local_220 [59];
  undefined1 local_1e5;
  allocator local_1e4;
  allocator local_1e3;
  allocator local_1e2;
  allocator local_1e1;
  _Rb_tree_node_base *local_1e0;
  _Rb_tree_node_base local_1d8;
  _Rb_tree_node_base local_1b8;
  _Rb_tree_node_base local_198;
  _Rb_tree_node_base local_178;
  _Rb_tree_node_base *local_158;
  _Base_ptr local_150;
  undefined4 local_128;
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 *local_118;
  undefined8 local_110;
  undefined1 local_e8;
  allocator local_e7;
  allocator local_e6;
  allocator local_e5 [20];
  allocator local_d1;
  string *local_d0;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string *local_48;
  undefined8 local_40;
  cartesian4 local_20;
  int local_10;
  int local_c;
  
  local_c = 0;
  for (local_10 = 0; dVar1 = (double)local_10, dVar2 = pow((double)*(int *)(in_RDI + 8),3.0),
      dVar1 < dVar2; local_10 = local_10 + 1) {
    local_20 = Lattice::indexToCoordinate(in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c);
    if (((local_20.z != *(int *)(in_RDI + 8) + -1) && (local_20.x != *(int *)(in_RDI + 8) + -1)) &&
       (local_20.y != *(int *)(in_RDI + 8) + -1)) {
      if (local_20.z < *(int *)(in_RDI + 8) + -2) {
        if (local_20.x != 0) {
          local_e8 = 1;
          local_d0 = local_c8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c8,"y",&local_d1);
          local_d0 = local_a8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a8,"z",local_e5);
          local_d0 = local_88;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_88,"z",&local_e6);
          local_d0 = local_68;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_68,"y",&local_e7);
          local_e8 = 0;
          local_48 = local_c8;
          local_40 = 4;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x18583c);
          __l._M_len = (size_type)in_stack_fffffffffffffb50;
          __l._M_array = in_stack_fffffffffffffb48;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb40,__l,(allocator_type *)in_stack_fffffffffffffb38);
          local_128 = 1;
          local_124 = 1;
          local_120 = 1;
          local_11c = 1;
          local_118 = &local_128;
          local_110 = 4;
          std::allocator<int>::allocator((allocator<int> *)0x1858c0);
          __l_00._M_len = (size_type)in_stack_fffffffffffffb50;
          __l_00._M_array = (iterator)in_stack_fffffffffffffb48;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb40,__l_00,
                     (allocator_type *)in_stack_fffffffffffffb38);
          Lattice::addFace((Lattice *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                           in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18,
                           in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffb20);
          std::allocator<int>::~allocator((allocator<int> *)0x18592e);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb20);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x185948);
          local_390 = (string *)&local_48;
          do {
            local_390 = local_390 + -0x20;
            std::__cxx11::string::~string(local_390);
          } while (local_390 != local_c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_e7);
          std::allocator<char>::~allocator((allocator<char> *)&local_e6);
          std::allocator<char>::~allocator((allocator<char> *)local_e5);
          std::allocator<char>::~allocator((allocator<char> *)&local_d1);
          local_c = local_c + 1;
        }
        if (local_20.y != 0) {
          local_1e5 = 1;
          local_1e0 = &local_1d8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1d8,"x",&local_1e1);
          local_1e0 = &local_1b8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1b8,"z",&local_1e2);
          local_1e0 = &local_198;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_198,"z",&local_1e3);
          local_1e0 = &local_178;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_178,"x",&local_1e4);
          local_1e5 = 0;
          local_158 = &local_1d8;
          local_150 = (_Base_ptr)0x4;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x185d45);
          __l_01._M_len = (size_type)in_stack_fffffffffffffb50;
          __l_01._M_array = in_stack_fffffffffffffb48;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb40,__l_01,(allocator_type *)in_stack_fffffffffffffb38);
          local_220._0_4_ = 1;
          local_220._4_4_ = 1;
          local_220._8_4_ = 1;
          local_220._12_4_ = 1;
          local_220._16_8_ = local_220;
          local_220._24_8_ = (pointer)0x4;
          std::allocator<int>::allocator((allocator<int> *)0x185dc9);
          __l_02._M_len = (size_type)in_stack_fffffffffffffb50;
          __l_02._M_array = (iterator)in_stack_fffffffffffffb48;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb40,__l_02,
                     (allocator_type *)in_stack_fffffffffffffb38);
          Lattice::addFace((Lattice *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                           in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18,
                           in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
          std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffb20);
          std::allocator<int>::~allocator((allocator<int> *)0x185e37);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb20);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x185e51);
          local_428 = (_Rb_tree_node_base *)&local_158;
          do {
            local_428 = local_428 + -1;
            std::__cxx11::string::~string((string *)local_428);
          } while (local_428 != &local_1d8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e4);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e3);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e2);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
          local_c = local_c + 1;
        }
      }
      in_stack_fffffffffffffd20 = CONCAT13(1,(int3)in_stack_fffffffffffffd20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_2d0,"x",(allocator *)&stack0xfffffffffffffd27);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_2d0 + 0x20),"y",(allocator *)&stack0xfffffffffffffd26);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_290,"y",(allocator *)&stack0xfffffffffffffd25);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_270,"x",(allocator *)&stack0xfffffffffffffd24);
      in_stack_fffffffffffffd20 = in_stack_fffffffffffffd20 & 0xffffff;
      local_250._0_8_ = local_2d0;
      local_250._8_8_ = (pointer)0x4;
      in_stack_fffffffffffffb50 = &stack0xfffffffffffffd22;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x18621b);
      __l_03._M_len = (size_type)in_stack_fffffffffffffb50;
      __l_03._M_array = in_stack_fffffffffffffb48;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb40,__l_03,(allocator_type *)in_stack_fffffffffffffb38);
      local_318 = 1;
      local_314 = 1;
      local_310 = 1;
      local_30c = 1;
      local_308 = &local_318;
      local_300 = 4;
      in_stack_fffffffffffffb48 = &local_319;
      std::allocator<int>::allocator((allocator<int> *)0x186299);
      __l_04._M_len = (size_type)in_stack_fffffffffffffb50;
      __l_04._M_array = (iterator)in_stack_fffffffffffffb48;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb40,__l_04,
                 (allocator_type *)in_stack_fffffffffffffb38);
      Lattice::addFace((Lattice *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                       in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10
                       ,in_stack_fffffffffffffd08);
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffb20);
      std::allocator<int>::~allocator((allocator<int> *)0x186304);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb20);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x18631e);
      in_stack_fffffffffffffb38 = (Lattice *)local_2d0;
      in_stack_fffffffffffffb30 = (Lattice *)local_250;
      do {
        in_stack_fffffffffffffb30 =
             (Lattice *)
             &in_stack_fffffffffffffb30[-1].upEdgesMap._M_t._M_impl.super__Rb_tree_header.
              _M_node_count;
        std::__cxx11::string::~string((string *)in_stack_fffffffffffffb30);
      } while (in_stack_fffffffffffffb30 != in_stack_fffffffffffffb38);
      in_stack_fffffffffffffb40 = in_stack_fffffffffffffb30;
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd24);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd25);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd26);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd27);
      local_c = local_c + 1;
    }
  }
  return;
}

Assistant:

void CubicLattice::createFaces()
{
    int faceIndex = 0;
    for (int vertexIndex = 0; vertexIndex < pow(l, 3); ++vertexIndex)
    {
        cartesian4 coordinate = indexToCoordinate(vertexIndex);
        if (coordinate.z == l - 1 || coordinate.x == l - 1 || coordinate.y == l - 1)
        {
            continue;
        }
        if (coordinate.z < l - 2)
        {
            if (!(coordinate.x == 0))
            {
                // Add yz face
                addFace(vertexIndex, faceIndex, {"y", "z", "z", "y"}, {1, 1, 1, 1});
                ++faceIndex;
            }
            if (!(coordinate.y == 0))
            {
                // Add xz face
                addFace(vertexIndex, faceIndex, {"x", "z", "z", "x"}, {1, 1, 1, 1});
                ++faceIndex;
            }
        }
        // Add xy face
        addFace(vertexIndex, faceIndex, {"x", "y", "y", "x"}, {1, 1, 1, 1});
        ++faceIndex;
    }
}